

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSFixed32Array
               (int32 *a,int n,CodedOutputStream *output)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  WriteArray<int>((int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
                  (CodedOutputStream *)0x4475c3);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32Array(const int32* a, int n,
                                        io::CodedOutputStream* output) {
  WriteArray<int32>(a, n, output);
}